

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O0

__sighandler_t __thiscall tlx::Semaphore::signal(Semaphore *this,int __sig,__sighandler_t __handler)

{
  __sighandler_t p_Var1;
  size_t res;
  unique_lock<std::mutex> lock;
  Semaphore *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&res,&this->mutex_);
  p_Var1 = (__sighandler_t)(this->value_ + 1);
  this->value_ = (size_t)p_Var1;
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&res);
  return p_Var1;
}

Assistant:

size_t signal() {
        std::unique_lock<std::mutex> lock(mutex_);
        size_t res = ++value_;
        cv_.notify_one();
        return res;
    }